

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_CCtx_loadDictionary_advanced
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,
                 ZSTD_dictContentType_e dictContentType)

{
  ZSTD_compressionParameters cParams_00;
  ZSTD_CDict *pZVar1;
  size_t sVar2;
  ZSTD_compressionParameters cParams;
  
  if (cctx->streamStage == zcss_init) {
    sVar2 = 0xffffffffffffffc0;
    if (cctx->staticSize == 0) {
      ZSTD_freeCDict(cctx->cdictLocal);
      if (dict == (void *)0x0 || dictSize == 0) {
        cctx->cdictLocal = (ZSTD_CDict *)0x0;
        cctx->cdict = (ZSTD_CDict *)0x0;
      }
      else {
        ZSTD_getCParamsFromCCtxParams
                  (&cParams,&cctx->requestedParams,cctx->pledgedSrcSizePlusOne - 1,dictSize);
        cParams_00.hashLog = cParams.hashLog;
        cParams_00.windowLog = cParams.windowLog;
        cParams_00.chainLog = cParams.chainLog;
        cParams_00.searchLog = cParams.searchLog;
        cParams_00.searchLength = cParams.searchLength;
        cParams_00.targetLength = cParams.targetLength;
        cParams_00.strategy = cParams.strategy;
        pZVar1 = ZSTD_createCDict_advanced
                           (dict,dictSize,dictLoadMethod,dictContentType,cParams_00,cctx->customMem)
        ;
        cctx->cdictLocal = pZVar1;
        cctx->cdict = pZVar1;
        if (pZVar1 == (ZSTD_CDict *)0x0) {
          return 0xffffffffffffffc0;
        }
      }
      sVar2 = 0;
    }
  }
  else {
    sVar2 = 0xffffffffffffffc4;
  }
  return sVar2;
}

Assistant:

size_t ZSTD_CCtx_loadDictionary_advanced(
        ZSTD_CCtx* cctx, const void* dict, size_t dictSize,
        ZSTD_dictLoadMethod_e dictLoadMethod, ZSTD_dictContentType_e dictContentType)
{
    if (cctx->streamStage != zcss_init) return ERROR(stage_wrong);
    if (cctx->staticSize) return ERROR(memory_allocation);  /* no malloc for static CCtx */
    DEBUGLOG(4, "ZSTD_CCtx_loadDictionary_advanced (size: %u)", (U32)dictSize);
    ZSTD_freeCDict(cctx->cdictLocal);  /* in case one already exists */
    if (dict==NULL || dictSize==0) {   /* no dictionary mode */
        cctx->cdictLocal = NULL;
        cctx->cdict = NULL;
    } else {
        ZSTD_compressionParameters const cParams =
                ZSTD_getCParamsFromCCtxParams(&cctx->requestedParams, cctx->pledgedSrcSizePlusOne-1, dictSize);
        cctx->cdictLocal = ZSTD_createCDict_advanced(
                                dict, dictSize,
                                dictLoadMethod, dictContentType,
                                cParams, cctx->customMem);
        cctx->cdict = cctx->cdictLocal;
        if (cctx->cdictLocal == NULL)
            return ERROR(memory_allocation);
    }
    return 0;
}